

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error comma(context *ctx,token *token,opcode *op)

{
  error *tmpres___LINE__;
  token local_48;
  
  confirm_type((token *)ctx,(token_type)op);
  if (ctx->pc == 0) {
    context::tokenize(&local_48,(context *)token);
    *(int *)&op[2].value = local_48.column;
    op[1].value = (uint64_t)local_48.data.string._M_str;
    op[1].reuse = local_48.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
    op->value = (uint64_t)local_48.filename;
    op->reuse = local_48.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
    ctx->pc = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(comma)
{
    CHECK(confirm_type(token, token_type::comma));
    token = ctx.tokenize();
    return {};
}